

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

size_t WitnessSigOps(int witversion,
                    vector<unsigned_char,_std::allocator<unsigned_char>_> *witprogram,
                    CScriptWitness *witness)

{
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  first;
  uint uVar1;
  size_type sVar2;
  int in_EDI;
  long in_FS_OFFSET;
  CScript subscript;
  CScript *in_stack_ffffffffffffff78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff80;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  ulong local_30;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_EDI == 0) {
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_ffffffffffffff78);
    if (sVar2 == 0x14) {
      local_30 = 1;
      goto LAB_008b5333;
    }
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_ffffffffffffff78);
    if ((sVar2 == 0x20) &&
       (sVar2 = std::
                vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::size((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)in_stack_ffffffffffffff78), sVar2 != 0)) {
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)in_stack_ffffffffffffff78);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_ffffffffffffff80);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)in_stack_ffffffffffffff78);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_ffffffffffffff80);
      last._M_current = local_28;
      first._M_current._4_4_ = in_stack_ffffffffffffff9c;
      first._M_current._0_4_ = in_stack_ffffffffffffff98;
      CScript::
      CScript<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                (in_stack_ffffffffffffff78,first,last);
      uVar1 = CScript::GetSigOpCount
                        ((CScript *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         SUB81((ulong)last._M_current >> 0x38,0));
      local_30 = (ulong)uVar1;
      CScript::~CScript(in_stack_ffffffffffffff78);
      goto LAB_008b5333;
    }
  }
  local_30 = 0;
LAB_008b5333:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_30;
}

Assistant:

size_t static WitnessSigOps(int witversion, const std::vector<unsigned char>& witprogram, const CScriptWitness& witness)
{
    if (witversion == 0) {
        if (witprogram.size() == WITNESS_V0_KEYHASH_SIZE)
            return 1;

        if (witprogram.size() == WITNESS_V0_SCRIPTHASH_SIZE && witness.stack.size() > 0) {
            CScript subscript(witness.stack.back().begin(), witness.stack.back().end());
            return subscript.GetSigOpCount(true);
        }
    }

    // Future flags may be implemented here.
    return 0;
}